

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_hpf1_process_pcm_frames
                    (ma_hpf1 *pHPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  ma_int32 y_1;
  ma_int32 x_1;
  ma_int32 r1_1;
  ma_int32 b_1;
  ma_int32 a_1;
  ma_uint32 channels_1;
  ma_uint32 c_1;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  void *local_a0;
  uint local_94;
  ma_int16 *pX_1;
  ma_int16 *pY_1;
  float *pX;
  float *pY;
  ma_uint32 n;
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_hpf1 *pHPF_local;
  float y;
  float x;
  float r1;
  float b;
  float a;
  ma_uint32 channels;
  ma_uint32 c;
  
  if (((pHPF == (ma_hpf1 *)0x0) || (pFramesOut == (void *)0x0)) || (pFramesIn == (void *)0x0)) {
    pX._0_4_ = MA_INVALID_ARGS;
  }
  else {
    if (pHPF->format == ma_format_f32) {
      local_a8 = pFramesIn;
      local_a0 = pFramesOut;
      for (local_94 = 0; local_94 < frameCount; local_94 = local_94 + 1) {
        uVar1 = pHPF->channels;
        fVar4 = 1.0 - (pHPF->a).f32;
        for (frameCount_local._4_4_ = 0; frameCount_local._4_4_ < uVar1;
            frameCount_local._4_4_ = frameCount_local._4_4_ + 1) {
          fVar5 = (1.0 - fVar4) * *(float *)((long)local_a8 + (ulong)frameCount_local._4_4_ * 4) +
                  -(fVar4 * pHPF->pR1[frameCount_local._4_4_].f32);
          *(float *)((long)local_a0 + (ulong)frameCount_local._4_4_ * 4) = fVar5;
          pHPF->pR1[frameCount_local._4_4_].f32 = fVar5;
        }
        local_a0 = (void *)((long)local_a0 + (ulong)pHPF->channels * 4);
        local_a8 = (void *)((long)local_a8 + (ulong)pHPF->channels * 4);
      }
    }
    else {
      if (pHPF->format != ma_format_s16) {
        return MA_INVALID_ARGS;
      }
      local_b8 = pFramesIn;
      local_b0 = pFramesOut;
      for (local_94 = 0; local_94 < frameCount; local_94 = local_94 + 1) {
        uVar1 = pHPF->channels;
        iVar2 = 0x4000 - (pHPF->a).s32;
        for (c = 0; c < uVar1; c = c + 1) {
          iVar3 = (0x4000 - iVar2) * (int)*(short *)((long)local_b8 + (ulong)c * 2) -
                  iVar2 * pHPF->pR1[c].s32 >> 0xe;
          *(short *)((long)local_b0 + (ulong)c * 2) = (short)iVar3;
          pHPF->pR1[c].s32 = iVar3;
        }
        local_b0 = (void *)((long)local_b0 + (ulong)pHPF->channels * 2);
        local_b8 = (void *)((long)local_b8 + (ulong)pHPF->channels * 2);
      }
    }
    pX._0_4_ = MA_SUCCESS;
  }
  return (ma_result)pX;
}

Assistant:

MA_API ma_result ma_hpf1_process_pcm_frames(ma_hpf1* pHPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint32 n;

    if (pHPF == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Note that the logic below needs to support in-place filtering. That is, it must support the case where pFramesOut and pFramesIn are the same. */

    if (pHPF->format == ma_format_f32) {
        /* */ float* pY = (      float*)pFramesOut;
        const float* pX = (const float*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_hpf1_process_pcm_frame_f32(pHPF, pY, pX);
            pY += pHPF->channels;
            pX += pHPF->channels;
        }
    } else if (pHPF->format == ma_format_s16) {
        /* */ ma_int16* pY = (      ma_int16*)pFramesOut;
        const ma_int16* pX = (const ma_int16*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_hpf1_process_pcm_frame_s16(pHPF, pY, pX);
            pY += pHPF->channels;
            pX += pHPF->channels;
        }
    } else {
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS; /* Format not supported. Should never hit this because it's checked in ma_biquad_init() and ma_biquad_reinit(). */
    }

    return MA_SUCCESS;
}